

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-test.h
# Opt level: O1

ParamGenerator<(anonymous_namespace)::CcsTestCase> __thiscall
testing::
ValuesIn<std::vector<(anonymous_namespace)::CcsTestCase,std::allocator<(anonymous_namespace)::CcsTestCase>>>
          (testing *this,
          vector<(anonymous_namespace)::CcsTestCase,_std::allocator<(anonymous_namespace)::CcsTestCase>_>
          *container)

{
  pointer pCVar1;
  pointer pCVar2;
  long lVar3;
  undefined8 *puVar4;
  pointer pCVar5;
  undefined8 *puVar6;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long lVar7;
  _Vector_base<(anonymous_namespace)::CcsTestCase,_std::allocator<(anonymous_namespace)::CcsTestCase>_>
  *this_00;
  ParamGenerator<(anonymous_namespace)::CcsTestCase> PVar8;
  
  pCVar1 = (container->
           super__Vector_base<(anonymous_namespace)::CcsTestCase,_std::allocator<(anonymous_namespace)::CcsTestCase>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pCVar2 = (container->
           super__Vector_base<(anonymous_namespace)::CcsTestCase,_std::allocator<(anonymous_namespace)::CcsTestCase>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  puVar4 = (undefined8 *)operator_new(0x20);
  *puVar4 = &PTR__ValuesInIteratorRangeGenerator_001a8bc8;
  puVar4[1] = 0;
  puVar4[2] = 0;
  puVar4[3] = 0;
  this_00 = (_Vector_base<(anonymous_namespace)::CcsTestCase,_std::allocator<(anonymous_namespace)::CcsTestCase>_>
             *)(((long)pCVar2 - (long)pCVar1 >> 3) * 0x2e8ba2e8ba2e8ba3);
  if ((_Vector_base<(anonymous_namespace)::CcsTestCase,_std::allocator<(anonymous_namespace)::CcsTestCase>_>
       *)0x1745d1745d1745d < this_00) {
    std::__throw_length_error("cannot create std::vector larger than max_size()");
  }
  pCVar5 = std::
           _Vector_base<(anonymous_namespace)::CcsTestCase,_std::allocator<(anonymous_namespace)::CcsTestCase>_>
           ::_M_allocate(this_00,(size_t)container);
  puVar4[1] = pCVar5;
  puVar4[3] = ((long)pCVar2 - (long)pCVar1) + (long)pCVar5;
  if (pCVar1 != pCVar2) {
    lVar3 = 0;
    do {
      lVar7 = lVar3;
      *(char **)((long)&(pCVar5->name)._M_dataplus._M_p + lVar7) =
           (pCVar5->name).field_2._M_local_buf + lVar7;
      lVar3 = *(long *)((long)&(pCVar1->name)._M_dataplus._M_p + lVar7);
      std::__cxx11::string::_M_construct<char*>
                ((string *)((long)&(pCVar5->name)._M_dataplus._M_p + lVar7),lVar3,
                 *(long *)((long)&(pCVar1->name)._M_string_length + lVar7) + lVar3);
      *(char **)((long)&(pCVar5->ccs)._M_dataplus._M_p + lVar7) =
           (pCVar5->ccs).field_2._M_local_buf + lVar7;
      lVar3 = *(long *)((long)&(pCVar1->ccs)._M_dataplus._M_p + lVar7);
      std::__cxx11::string::_M_construct<char*>
                ((string *)((long)&(pCVar5->ccs)._M_dataplus._M_p + lVar7),lVar3,
                 *(long *)((long)&(pCVar1->ccs)._M_string_length + lVar7) + lVar3);
      std::
      vector<(anonymous_namespace)::Assertion,_std::allocator<(anonymous_namespace)::Assertion>_>::
      vector((vector<(anonymous_namespace)::Assertion,_std::allocator<(anonymous_namespace)::Assertion>_>
              *)((long)&(pCVar5->assertions).
                        super__Vector_base<(anonymous_namespace)::Assertion,_std::allocator<(anonymous_namespace)::Assertion>_>
                        ._M_impl.super__Vector_impl_data._M_start + lVar7),
             (vector<(anonymous_namespace)::Assertion,_std::allocator<(anonymous_namespace)::Assertion>_>
              *)((long)&(pCVar1->assertions).
                        super__Vector_base<(anonymous_namespace)::Assertion,_std::allocator<(anonymous_namespace)::Assertion>_>
                        ._M_impl.super__Vector_impl_data._M_start + lVar7));
      lVar3 = lVar7 + 0x58;
    } while ((pointer)((long)&pCVar1[1].name._M_dataplus._M_p + lVar7) != pCVar2);
    pCVar5 = (pointer)((long)&pCVar5[1].name._M_dataplus._M_p + lVar7);
  }
  puVar4[2] = pCVar5;
  *(undefined8 **)this = puVar4;
  *(undefined8 *)(this + 8) = 0;
  puVar6 = (undefined8 *)operator_new(0x18);
  puVar6[1] = 0x100000001;
  *puVar6 = &PTR___Sp_counted_base_001a8c90;
  puVar6[2] = puVar4;
  *(undefined8 **)(this + 8) = puVar6;
  PVar8.impl_.
  super___shared_ptr<const_testing::internal::ParamGeneratorInterface<(anonymous_namespace)::CcsTestCase>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = extraout_RDX._M_pi;
  PVar8.impl_.
  super___shared_ptr<const_testing::internal::ParamGeneratorInterface<(anonymous_namespace)::CcsTestCase>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)this;
  return (ParamGenerator<(anonymous_namespace)::CcsTestCase>)
         PVar8.impl_.
         super___shared_ptr<const_testing::internal::ParamGeneratorInterface<(anonymous_namespace)::CcsTestCase>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

internal::ParamGenerator<typename Container::value_type> ValuesIn(
    const Container& container) {
  return ValuesIn(container.begin(), container.end());
}